

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

void av1_fill_coeff_costs(CoeffCosts *coeff_costs,FRAME_CONTEXT *fc,int num_planes)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  aom_cdf_prob (*paaaVar10) [2] [10];
  aom_cdf_prob (*paaaVar11) [2] [11];
  int *piVar12;
  int ctx_2;
  int iVar13;
  int (*paiVar14) [26];
  ulong uVar15;
  int ctx;
  long lVar16;
  CoeffCosts *pCVar17;
  long lVar18;
  aom_cdf_prob (*cdf) [9];
  int *piVar19;
  LV_MAP_EOB_COST *pLVar20;
  LV_MAP_EOB_COST *costs;
  int eob_multi_size;
  ulong uVar21;
  CoeffCosts *costs_00;
  aom_cdf_prob (*cdf_00) [2] [4] [4];
  aom_cdf_prob (*cdf_01) [2] [42] [5];
  aom_cdf_prob (*cdf_02) [2] [9] [3];
  aom_cdf_prob (*cdf_03) [3] [3];
  ulong uVar22;
  FRAME_CONTEXT *pFVar23;
  int (*paiVar24) [26];
  long lVar25;
  bool bVar26;
  int br_rate [4];
  LV_MAP_EOB_COST *local_f0;
  ulong local_e8;
  aom_cdf_prob (*local_d8) [2] [42] [5];
  aom_cdf_prob (*local_d0) [2] [4] [4];
  aom_cdf_prob (*local_c8) [2] [42] [5];
  aom_cdf_prob (*local_c0) [2] [9] [3];
  aom_cdf_prob (*local_b8) [3] [3];
  int (*local_b0) [26];
  aom_cdf_prob (*local_a8) [2] [12];
  CoeffCosts *local_80;
  int *local_78;
  int (*local_70) [26];
  aom_cdf_prob (*local_68) [2] [9] [3];
  int local_48 [6];
  
  uVar9 = 2;
  if (num_planes < 2) {
    uVar9 = (ulong)(uint)num_planes;
  }
  local_f0 = coeff_costs->eob_costs[0];
  uVar21 = 0;
  do {
    if (0 < num_planes) {
      uVar22 = 0;
      pLVar20 = local_f0;
      local_a8 = fc->eob_flag_cdf1024;
      do {
        lVar25 = 0;
        lVar16 = 0;
        costs = pLVar20;
        do {
          switch(uVar21 & 0xffffffff) {
          case 0:
            paaaVar10 = (aom_cdf_prob (*) [2] [10])(fc->eob_flag_cdf16 + uVar22);
            lVar18 = lVar16 * 2;
            goto LAB_0021731e;
          case 1:
            cdf = (aom_cdf_prob (*) [9])(fc->eob_flag_cdf32[uVar22] + lVar16);
            break;
          case 2:
            paaaVar11 = (aom_cdf_prob (*) [2] [11])(fc->eob_flag_cdf64 + uVar22);
            lVar18 = lVar16 << 4;
            goto LAB_0021739b;
          case 3:
            cdf = fc->eob_flag_cdf128[uVar22] + lVar16;
            break;
          case 4:
            paaaVar10 = fc->eob_flag_cdf256 + uVar22;
            lVar18 = lVar16 * 4;
LAB_0021731e:
            cdf = (aom_cdf_prob (*) [9])((*paaaVar10)[0] + (lVar18 + lVar16) * 2);
            break;
          case 5:
            paaaVar11 = fc->eob_flag_cdf512 + uVar22;
            lVar18 = lVar16 * 0x16;
LAB_0021739b:
            cdf = (aom_cdf_prob (*) [9])((long)(*paaaVar11)[0] + lVar18);
            break;
          default:
            cdf = (aom_cdf_prob (*) [9])((long)(*local_a8)[0] + lVar25);
          }
          av1_cost_tokens_from_cdf((int *)costs,*cdf,(int *)0x0);
          lVar16 = lVar16 + 1;
          lVar25 = lVar25 + 0x18;
          costs = (LV_MAP_EOB_COST *)(((LV_MAP_EOB_COST *)costs->eob_cost)->eob_cost + 1);
        } while (lVar25 == 0x18);
        uVar22 = uVar22 + 1;
        pLVar20 = pLVar20 + 1;
        local_a8 = local_a8 + 1;
      } while (uVar22 != uVar9);
    }
    uVar21 = uVar21 + 1;
    local_f0 = local_f0 + 2;
    if (uVar21 == 7) {
      local_f0 = (LV_MAP_EOB_COST *)fc->coeff_base_eob_cdf;
      local_d8 = fc->coeff_base_cdf;
      local_68 = fc->eob_extra_cdf;
      local_70 = coeff_costs->coeff_costs[0][0].lps_cost;
      local_78 = coeff_costs->coeff_costs[0][0].lps_cost[0] + 0xe;
      local_e8 = 0;
      pFVar23 = fc;
      local_80 = coeff_costs;
      do {
        if (0 < num_planes) {
          uVar21 = 3;
          if ((uint)local_e8 < 3) {
            uVar21 = local_e8 & 0xffffffff;
          }
          local_b0 = local_70;
          local_c0 = local_68;
          local_c8 = local_d8;
          local_d0 = (aom_cdf_prob (*) [2] [4] [4])local_f0;
          uVar22 = 0;
          pCVar17 = local_80;
          piVar19 = local_78;
          local_b8 = fc->dc_sign_cdf;
          do {
            lVar16 = 0;
            costs_00 = pCVar17;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)costs_00,
                         (aom_cdf_prob *)((long)pFVar23->txb_skip_cdf[0][0] + lVar16),(int *)0x0);
              costs_00 = (CoeffCosts *)(costs_00->coeff_costs[0][0].txb_skip_cost + 1);
              lVar16 = lVar16 + 6;
            } while (lVar16 != 0x4e);
            lVar16 = 0x68;
            cdf_00 = local_d0;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)((long)pCVar17->coeff_costs[0][0].txb_skip_cost[0] + lVar16),
                         (aom_cdf_prob *)cdf_00,(int *)0x0);
              lVar16 = lVar16 + 0xc;
              cdf_00 = (aom_cdf_prob (*) [2] [4] [4])((*cdf_00)[0] + 1);
            } while (lVar16 != 0x98);
            lVar16 = 0x98;
            cdf_01 = local_c8;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)((long)pCVar17->coeff_costs[0][0].txb_skip_cost[0] + lVar16),
                         (aom_cdf_prob *)cdf_01,(int *)0x0);
              lVar16 = lVar16 + 0x20;
              cdf_01 = (aom_cdf_prob (*) [2] [42] [5])((*cdf_01)[0] + 1);
            } while (lVar16 != 0x5d8);
            lVar16 = 0xb4;
            do {
              *(undefined4 *)((long)(pCVar17->coeff_costs + -1) + 0x1d74 + lVar16) = 0;
              iVar13 = *(int *)((long)(pCVar17->coeff_costs + -1) + 0x1d68 + lVar16);
              iVar4 = *(int *)((long)(pCVar17->coeff_costs + -1) + 0x1d6c + lVar16);
              *(int *)((long)(pCVar17->coeff_costs + -1) + 0x1d78 + lVar16) =
                   (iVar13 - *(int *)((long)(pCVar17->coeff_costs + -1) + 0x1d64 + lVar16)) + 0x200;
              *(int *)((long)(pCVar17->coeff_costs + -1) + 0x1d7c + lVar16) = iVar4 - iVar13;
              *(int *)((long)pCVar17->coeff_costs[0][0].txb_skip_cost[0] + lVar16) =
                   *(int *)((long)(pCVar17->coeff_costs + -1) + 0x1d70 + lVar16) - iVar4;
              lVar16 = lVar16 + 0x20;
            } while (lVar16 != 0x5f4);
            lVar16 = 0x5d8;
            cdf_02 = local_c0;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)((long)pCVar17->coeff_costs[0][0].txb_skip_cost[0] + lVar16),
                         (aom_cdf_prob *)cdf_02,(int *)0x0);
              lVar16 = lVar16 + 8;
              cdf_02 = (aom_cdf_prob (*) [2] [9] [3])((*cdf_02)[0] + 1);
            } while (lVar16 != 0x620);
            lVar16 = 0x620;
            cdf_03 = local_b8;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)((long)pCVar17->coeff_costs[0][0].txb_skip_cost[0] + lVar16),
                         (aom_cdf_prob *)cdf_03,(int *)0x0);
              lVar16 = lVar16 + 8;
              cdf_03 = (aom_cdf_prob (*) [3] [3])(*cdf_03 + 1);
            } while (lVar16 != 0x638);
            lVar16 = 0;
            paiVar24 = local_b0;
            do {
              av1_cost_tokens_from_cdf(local_48,fc->coeff_br_cdf[uVar21][uVar22][lVar16],(int *)0x0)
              ;
              iVar13 = 0;
              paiVar14 = paiVar24;
              uVar15 = 0;
              do {
                lVar25 = 0;
                do {
                  (*paiVar14)[lVar25] = local_48[lVar25] + iVar13;
                  lVar25 = lVar25 + 1;
                } while (lVar25 != 3);
                iVar13 = iVar13 + local_48[3];
                paiVar14 = (int (*) [26])(*paiVar14 + 3);
                bVar26 = uVar15 < 9;
                uVar15 = uVar15 + 3;
              } while (bVar26);
              coeff_costs->coeff_costs[local_e8][uVar22].lps_cost[lVar16][0xc] = iVar13;
              lVar16 = lVar16 + 1;
              paiVar24 = paiVar24 + 1;
            } while (lVar16 != 0x15);
            lVar16 = 0;
            piVar12 = piVar19;
            do {
              coeff_costs->coeff_costs[local_e8][uVar22].lps_cost[lVar16][0xd] =
                   coeff_costs->coeff_costs[local_e8][uVar22].lps_cost[lVar16][0];
              lVar25 = -0xc;
              do {
                piVar1 = piVar12 + lVar25 + -2;
                iVar13 = piVar1[1];
                iVar4 = piVar1[2];
                iVar5 = piVar1[3];
                piVar2 = piVar12 + lVar25 + -1;
                iVar6 = piVar2[1];
                iVar7 = piVar2[2];
                iVar8 = piVar2[3];
                piVar3 = piVar12 + lVar25 + 0xc;
                *piVar3 = *piVar2 - *piVar1;
                piVar3[1] = iVar6 - iVar13;
                piVar3[2] = iVar7 - iVar4;
                piVar3[3] = iVar8 - iVar5;
                lVar25 = lVar25 + 4;
              } while (lVar25 != 0);
              lVar16 = lVar16 + 1;
              piVar12 = piVar12 + 0x1a;
            } while (lVar16 != 0x15);
            uVar22 = uVar22 + 1;
            pCVar17 = (CoeffCosts *)(pCVar17->coeff_costs[0] + 1);
            local_d0 = (aom_cdf_prob (*) [2] [4] [4])(*local_d0 + 1);
            local_c8 = (aom_cdf_prob (*) [2] [42] [5])(*local_c8 + 1);
            local_c0 = (aom_cdf_prob (*) [2] [9] [3])(*local_c0 + 1);
            local_b8 = local_b8 + 1;
            local_b0 = (int (*) [26])((long)(local_b0 + 0x24) + 0x20);
            piVar19 = piVar19 + 0x3b0;
          } while (uVar22 != uVar9);
        }
        local_e8 = local_e8 + 1;
        local_80 = (CoeffCosts *)(local_80->coeff_costs + 1);
        pFVar23 = (FRAME_CONTEXT *)(pFVar23->txb_skip_cdf + 1);
        local_f0 = (LV_MAP_EOB_COST *)((long)local_f0 + 0x40);
        local_d8 = local_d8 + 1;
        local_68 = local_68 + 1;
        local_70 = (int (*) [26])((long)(local_70 + 0x48) + 0x40);
        local_78 = local_78 + 0x760;
      } while (local_e8 != 5);
      return;
    }
  } while( true );
}

Assistant:

void av1_fill_coeff_costs(CoeffCosts *coeff_costs, FRAME_CONTEXT *fc,
                          const int num_planes) {
  const int nplanes = AOMMIN(num_planes, PLANE_TYPES);
  for (int eob_multi_size = 0; eob_multi_size < 7; ++eob_multi_size) {
    for (int plane = 0; plane < nplanes; ++plane) {
      LV_MAP_EOB_COST *pcost = &coeff_costs->eob_costs[eob_multi_size][plane];

      for (int ctx = 0; ctx < 2; ++ctx) {
        aom_cdf_prob *pcdf;
        switch (eob_multi_size) {
          case 0: pcdf = fc->eob_flag_cdf16[plane][ctx]; break;
          case 1: pcdf = fc->eob_flag_cdf32[plane][ctx]; break;
          case 2: pcdf = fc->eob_flag_cdf64[plane][ctx]; break;
          case 3: pcdf = fc->eob_flag_cdf128[plane][ctx]; break;
          case 4: pcdf = fc->eob_flag_cdf256[plane][ctx]; break;
          case 5: pcdf = fc->eob_flag_cdf512[plane][ctx]; break;
          case 6:
          default: pcdf = fc->eob_flag_cdf1024[plane][ctx]; break;
        }
        av1_cost_tokens_from_cdf(pcost->eob_cost[ctx], pcdf, NULL);
      }
    }
  }
  for (int tx_size = 0; tx_size < TX_SIZES; ++tx_size) {
    for (int plane = 0; plane < nplanes; ++plane) {
      LV_MAP_COEFF_COST *pcost = &coeff_costs->coeff_costs[tx_size][plane];

      for (int ctx = 0; ctx < TXB_SKIP_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->txb_skip_cost[ctx],
                                 fc->txb_skip_cdf[tx_size][ctx], NULL);

      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS_EOB; ++ctx)
        av1_cost_tokens_from_cdf(pcost->base_eob_cost[ctx],
                                 fc->coeff_base_eob_cdf[tx_size][plane][ctx],
                                 NULL);
      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->base_cost[ctx],
                                 fc->coeff_base_cdf[tx_size][plane][ctx], NULL);

      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS; ++ctx) {
        pcost->base_cost[ctx][4] = 0;
        pcost->base_cost[ctx][5] = pcost->base_cost[ctx][1] +
                                   av1_cost_literal(1) -
                                   pcost->base_cost[ctx][0];
        pcost->base_cost[ctx][6] =
            pcost->base_cost[ctx][2] - pcost->base_cost[ctx][1];
        pcost->base_cost[ctx][7] =
            pcost->base_cost[ctx][3] - pcost->base_cost[ctx][2];
      }

      for (int ctx = 0; ctx < EOB_COEF_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->eob_extra_cost[ctx],
                                 fc->eob_extra_cdf[tx_size][plane][ctx], NULL);

      for (int ctx = 0; ctx < DC_SIGN_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->dc_sign_cost[ctx],
                                 fc->dc_sign_cdf[plane][ctx], NULL);

      for (int ctx = 0; ctx < LEVEL_CONTEXTS; ++ctx) {
        int br_rate[BR_CDF_SIZE];
        int prev_cost = 0;
        int i, j;
        av1_cost_tokens_from_cdf(
            br_rate, fc->coeff_br_cdf[AOMMIN(tx_size, TX_32X32)][plane][ctx],
            NULL);
        for (i = 0; i < COEFF_BASE_RANGE; i += BR_CDF_SIZE - 1) {
          for (j = 0; j < BR_CDF_SIZE - 1; j++) {
            pcost->lps_cost[ctx][i + j] = prev_cost + br_rate[j];
          }
          prev_cost += br_rate[j];
        }
        pcost->lps_cost[ctx][i] = prev_cost;
      }
      for (int ctx = 0; ctx < LEVEL_CONTEXTS; ++ctx) {
        pcost->lps_cost[ctx][0 + COEFF_BASE_RANGE + 1] =
            pcost->lps_cost[ctx][0];
        for (int i = 1; i <= COEFF_BASE_RANGE; ++i) {
          pcost->lps_cost[ctx][i + COEFF_BASE_RANGE + 1] =
              pcost->lps_cost[ctx][i] - pcost->lps_cost[ctx][i - 1];
        }
      }
    }
  }
}